

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O1

void __thiscall
iutest::detail::iuValuesInParamsGenerator<bool>::iuValuesInParamsGenerator<bool,1ul>
          (iuValuesInParamsGenerator<bool> *this,bool (*values) [1])

{
  (this->super_iuIParamGenerator<bool>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_003a2c68;
  (this->m_values).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_values).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->m_values).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_values).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->m_values).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->m_it).super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_it).super__Bit_iterator_base._M_offset = 0;
  std::vector<bool,std::allocator<bool>>::_M_insert_range<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&this->m_values,0,0,values,values + 1);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }